

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_inc_helper_polar<ExchCXX::BuiltinPZ81>
               (double scal_fact,int N,const_host_buffer_type rho,host_buffer_type eps)

{
  long lVar1;
  double e;
  double local_30;
  
  if (0 < N) {
    lVar1 = 0;
    do {
      lda_screening_interface<ExchCXX::BuiltinPZ81>::eval_exc_polar
                (*(double *)((long)rho + lVar1 * 2),*(double *)((long)rho + lVar1 * 2 + 8),&local_30
                );
      *(double *)((long)eps + lVar1) = local_30 * scal_fact + *(double *)((long)eps + lVar1);
      lVar1 = lVar1 + 8;
    } while ((ulong)(uint)N << 3 != lVar1);
  }
  return;
}

Assistant:

LDA_EXC_INC_GENERATOR( host_eval_exc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto rho_i = rho + 2*i;

    double e;
    traits::eval_exc_polar( rho_i[0], rho_i[1], e );
    
    eps[i] += scal_fact * e;

  }

}